

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transition_table.cc
# Opt level: O3

void __thiscall
transition_table_multiple_updates_Test::TestBody(transition_table_multiple_updates_Test *this)

{
  return;
}

Assistant:

TEST(transition_table, multiple_updates) {
    auto tb1 = make_table(make_row(make_transition(
        state<s1>, event<e2>, _, [] { return s2{}; }, state<s2>)));
    static_assert(decltype(tb1)::size == 1, "");

    auto tb2 = std::move(tb1).update(make_transition(
        state<s1>, event<e1>, _, [] {}, _));
    static_assert(decltype(tb2)::size == 2, "");

    auto tb3 = std::move(tb2).update(make_transition(
        state<s1>, event<e2>, _, [] { return s3{3}; }, state<s3>));
    static_assert(decltype(tb3)::size == 2, "");

    auto tb4 = std::move(tb3).update(make_transition(
        state<s1>, event<e3>, _, [](auto e) noexcept { return s3{e.value}; }, state<s3>));
    static_assert(decltype(tb4)::size == 3, "");

    auto tb5 = std::move(tb4).update(make_transition(
        state<s3>, event<e3>, [](auto e) { return e.value > 0; }, [] { return s2{}; }, state<s2>));
    static_assert(decltype(tb5)::size == 4, "");

    auto tb6 = std::move(tb5).update(make_transition(
        state<s3>,
        event<e3>,
        [](auto e) { return e.value == 0; },
        [] { return s3{0}; },
        state<s3>));
    static_assert(decltype(tb6)::size == 4, "");

    namespace tr = ::state_machine::transition;
    using FirstKey = std::decay_t<decltype(std::get<0>(tb6.data()))>::key_type;
    static_assert(std::is_same<FirstKey, tr::Key<tr::State<s1>, tr::Event<e2>>>::value, "");
}